

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall
Application::onMessage(Application *this,NewOrderSingle *message,SessionID *sessionID)

{
  char cVar1;
  bool bVar2;
  int field;
  IncorrectTagValue *this_00;
  FieldBase *field_00;
  SessionNotFound *anon_var_0;
  AvgPx local_790;
  double local_738;
  LastPx local_730;
  double local_6d8;
  LastQty local_6d0;
  double local_678;
  CumQty local_670;
  QTY local_618;
  LeavesQty local_610;
  OrdStatus local_5b8;
  ExecType local_560;
  string local_508;
  ExecID local_4e8;
  string local_490;
  OrderID local_470;
  undefined1 local_418 [8];
  ExecutionReport executionReport;
  string local_2b8;
  undefined1 local_298 [8];
  Account account;
  ClOrdID clOrdID;
  Price price;
  OrderQty orderQty;
  OrdType ordType;
  undefined1 local_d0 [8];
  Side side;
  Symbol symbol;
  SessionID *sessionID_local;
  NewOrderSingle *message_local;
  Application *this_local;
  
  FIX::Symbol::Symbol((Symbol *)&side.super_CharField.super_FieldBase.m_metrics);
  FIX::Side::Side((Side *)local_d0);
  FIX::OrdType::OrdType((OrdType *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
  FIX::OrderQty::OrderQty((OrderQty *)&price.super_PriceField.super_FieldBase.m_metrics);
  FIX::Price::Price((Price *)&clOrdID.super_StringField.super_FieldBase.m_metrics);
  FIX::ClOrdID::ClOrdID((ClOrdID *)&account.super_StringField.super_FieldBase.m_metrics);
  FIX::Account::Account((Account *)local_298);
  FIX50::NewOrderSingle::get(message,(OrdType *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
  cVar1 = FIX::CharField::operator_cast_to_char
                    ((CharField *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
  if (cVar1 == '2') {
    FIX50::NewOrderSingle::get(message,(Symbol *)&side.super_CharField.super_FieldBase.m_metrics);
    FIX50::NewOrderSingle::get(message,(Side *)local_d0);
    FIX50::NewOrderSingle::get
              (message,(OrderQty *)&price.super_PriceField.super_FieldBase.m_metrics);
    FIX50::NewOrderSingle::get
              (message,(Price *)&clOrdID.super_StringField.super_FieldBase.m_metrics);
    FIX50::NewOrderSingle::get
              (message,(ClOrdID *)&account.super_StringField.super_FieldBase.m_metrics);
    genOrderID_abi_cxx11_(&local_490,this);
    FIX::OrderID::OrderID(&local_470,&local_490);
    genExecID_abi_cxx11_(&local_508,this);
    FIX::ExecID::ExecID(&local_4e8,&local_508);
    FIX::ExecType::ExecType(&local_560,"F11Application");
    FIX::OrdStatus::OrdStatus(&local_5b8,"22F11Application");
    local_618 = 0.0;
    FIX::LeavesQty::LeavesQty(&local_610,&local_618);
    local_678 = FIX::DoubleField::operator_cast_to_double
                          ((DoubleField *)&price.super_PriceField.super_FieldBase.m_metrics);
    FIX::CumQty::CumQty(&local_670,&local_678);
    FIX50::ExecutionReport::ExecutionReport
              ((ExecutionReport *)local_418,&local_470,&local_4e8,&local_560,&local_5b8,
               (Side *)local_d0,&local_610,&local_670);
    FIX::CumQty::~CumQty(&local_670);
    FIX::LeavesQty::~LeavesQty(&local_610);
    FIX::OrdStatus::~OrdStatus(&local_5b8);
    FIX::ExecType::~ExecType(&local_560);
    FIX::ExecID::~ExecID(&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    FIX::OrderID::~OrderID(&local_470);
    std::__cxx11::string::~string((string *)&local_490);
    FIX50::ExecutionReport::set
              ((ExecutionReport *)local_418,
               (ClOrdID *)&account.super_StringField.super_FieldBase.m_metrics);
    FIX50::ExecutionReport::set
              ((ExecutionReport *)local_418,
               (Symbol *)&side.super_CharField.super_FieldBase.m_metrics);
    FIX50::ExecutionReport::set
              ((ExecutionReport *)local_418,
               (OrderQty *)&price.super_PriceField.super_FieldBase.m_metrics);
    local_6d8 = FIX::DoubleField::operator_cast_to_double
                          ((DoubleField *)&price.super_PriceField.super_FieldBase.m_metrics);
    FIX::LastQty::LastQty(&local_6d0,&local_6d8);
    FIX50::ExecutionReport::set((ExecutionReport *)local_418,&local_6d0);
    FIX::LastQty::~LastQty(&local_6d0);
    local_738 = FIX::DoubleField::operator_cast_to_double
                          ((DoubleField *)&clOrdID.super_StringField.super_FieldBase.m_metrics);
    FIX::LastPx::LastPx(&local_730,&local_738);
    FIX50::ExecutionReport::set((ExecutionReport *)local_418,&local_730);
    FIX::LastPx::~LastPx(&local_730);
    anon_var_0 = (SessionNotFound *)
                 FIX::DoubleField::operator_cast_to_double
                           ((DoubleField *)&clOrdID.super_StringField.super_FieldBase.m_metrics);
    FIX::AvgPx::AvgPx(&local_790,(PRICE *)&anon_var_0);
    FIX50::ExecutionReport::set((ExecutionReport *)local_418,&local_790);
    FIX::AvgPx::~AvgPx(&local_790);
    bVar2 = FIX50::NewOrderSingle::isSet(message,(Account *)local_298);
    if (bVar2) {
      field_00 = (FieldBase *)FIX50::NewOrderSingle::get(message,(Account *)local_298);
      FIX::FieldMap::setField((FieldMap *)local_418,field_00,true);
    }
    FIX::Session::sendToTarget((Message *)local_418,sessionID);
    FIX50::ExecutionReport::~ExecutionReport((ExecutionReport *)local_418);
    FIX::Account::~Account((Account *)local_298);
    FIX::ClOrdID::~ClOrdID((ClOrdID *)&account.super_StringField.super_FieldBase.m_metrics);
    FIX::Price::~Price((Price *)&clOrdID.super_StringField.super_FieldBase.m_metrics);
    FIX::OrderQty::~OrderQty((OrderQty *)&price.super_PriceField.super_FieldBase.m_metrics);
    FIX::OrdType::~OrdType((OrdType *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
    FIX::Side::~Side((Side *)local_d0);
    FIX::Symbol::~Symbol((Symbol *)&side.super_CharField.super_FieldBase.m_metrics);
    return;
  }
  executionReport.super_Message._342_1_ = 1;
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  field = FIX::FieldBase::getTag((FieldBase *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"",(allocator<char> *)&executionReport.super_Message.field_0x157);
  FIX::IncorrectTagValue::IncorrectTagValue(this_00,field,&local_2b8);
  executionReport.super_Message._342_1_ = 0;
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::IncorrectTagValue::~IncorrectTagValue);
}

Assistant:

void Application::onMessage(const FIX50::NewOrderSingle &message, const FIX::SessionID &sessionID) {
  FIX::Symbol symbol;
  FIX::Side side;
  FIX::OrdType ordType;
  FIX::OrderQty orderQty;
  FIX::Price price;
  FIX::ClOrdID clOrdID;
  FIX::Account account;

  message.get(ordType);

  if (ordType != FIX::OrdType_LIMIT) {
    throw FIX::IncorrectTagValue(ordType.getTag());
  }

  message.get(symbol);
  message.get(side);
  message.get(orderQty);
  message.get(price);
  message.get(clOrdID);

  FIX50::ExecutionReport executionReport = FIX50::ExecutionReport(
      FIX::OrderID(genOrderID()),
      FIX::ExecID(genExecID()),
      FIX::ExecType(FIX::ExecType_TRADE),
      FIX::OrdStatus(FIX::OrdStatus_FILLED),
      side,
      FIX::LeavesQty(0),
      FIX::CumQty(orderQty));

  executionReport.set(clOrdID);
  executionReport.set(symbol);
  executionReport.set(orderQty);
  executionReport.set(FIX::LastQty(orderQty));
  executionReport.set(FIX::LastPx(price));
  executionReport.set(FIX::AvgPx(price));

  if (message.isSet(account)) {
    executionReport.setField(message.get(account));
  }

  try {
    FIX::Session::sendToTarget(executionReport, sessionID);
  } catch (FIX::SessionNotFound &) {}
}